

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O2

Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> __thiscall
kj::TlsNetwork::parseAddress(TlsNetwork *this,StringPtr addr,uint portHint)

{
  ArrayDisposer *pAVar1;
  bool bVar2;
  uint uVar3;
  undefined4 in_register_0000000c;
  size_t sVar4;
  ulong in_R8;
  Maybe<unsigned_long> MVar5;
  StringPtr value;
  StringPtr value_00;
  StringPtr value_01;
  Fault f;
  Array<char> local_70;
  StringPtr addr_local;
  String hostname;
  StringPtr local_30;
  
  sVar4 = CONCAT44(in_register_0000000c,portHint);
  addr_local.content.ptr = (char *)addr.content.size_;
  hostname.content.ptr = (char *)0x0;
  hostname.content.size_ = 0;
  hostname.content.disposer = (ArrayDisposer *)0x0;
  f.exception = (Exception *)0x44d24d;
  local_70.ptr = (char *)0x2;
  addr_local.content.size_ = sVar4;
  bVar2 = StringPtr::startsWith(&addr_local,(StringPtr *)&f);
  if (bVar2) {
    MVar5 = StringPtr::findFirst((StringPtr *)&f,(char)&addr_local);
    if ((char)f.exception == '\x01') {
      local_30.content.ptr = addr_local.content.ptr + 1;
      local_30.content.size_ = (size_t)(local_70.ptr + -1);
      str<kj::ArrayPtr<char_const>>
                ((String *)&f,(kj *)&local_30,(ArrayPtr<const_char> *)MVar5.ptr.field_1);
      Array<char>::operator=(&hostname.content,(Array<char> *)&f);
    }
    else {
      value_00.content.size_ = sVar4;
      value_00.content.ptr = (char *)addr_local.content.size_;
      heapString((String *)&f,(kj *)addr_local.content.ptr,value_00);
      Array<char>::operator=(&hostname.content,(Array<char> *)&f);
    }
LAB_003cf5a1:
    Array<char>::~Array((Array<char> *)&f);
    pAVar1 = (((Exception *)addr.content.ptr)->ownFile).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (&local_30,pAVar1,addr_local.content.ptr,addr_local.content.size_,in_R8 & 0xffffffff);
    local_70.ptr = hostname.content.ptr;
    local_70.size_ = hostname.content.size_;
    local_70.disposer = hostname.content.disposer;
    hostname.content.ptr = (char *)0x0;
    hostname.content.size_ = 0;
    f.exception = (Exception *)addr.content.ptr;
    Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>::
    then<kj::TlsNetwork::parseAddress(kj::StringPtr,unsigned_int)::_lambda(kj::Own<kj::NetworkAddress,decltype(nullptr)>&&)_1_>
              ((Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>> *)this,
               (anon_class_32_2_2106826e_for_func *)&local_30);
    Array<char>::~Array(&local_70);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_30);
    Array<char>::~Array(&hostname.content);
    return (PromiseBase)(PromiseBase)this;
  }
  f.exception = (Exception *)anon_var_dwarf_23e420;
  local_70.ptr = (char *)0x6;
  bVar2 = StringPtr::startsWith(&addr_local,(StringPtr *)&f);
  if (!bVar2) {
    local_30.content.ptr = "unix-abstract:";
    local_30.content.size_ = 0xf;
    bVar2 = StringPtr::startsWith(&addr_local,&local_30);
    if (!bVar2) {
      uVar3 = 0;
      for (sVar4 = 1; addr_local.content.size_ != sVar4; sVar4 = sVar4 + 1) {
        uVar3 = uVar3 + (addr_local.content.ptr[sVar4 - 1] == ':');
      }
      if (uVar3 < 2) {
        StringPtr::findFirst((StringPtr *)&f,(char)&addr_local);
        if ((char)f.exception == '\x01') {
          heapString((String *)&f,addr_local.content.ptr,(size_t)local_70.ptr);
          Array<char>::operator=(&hostname.content,(Array<char> *)&f);
        }
        else {
          value_01.content.size_ = sVar4;
          value_01.content.ptr = (char *)addr_local.content.size_;
          heapString((String *)&f,(kj *)addr_local.content.ptr,value_01);
          Array<char>::operator=(&hostname.content,(Array<char> *)&f);
        }
      }
      else {
        value.content.size_ = sVar4;
        value.content.ptr = (char *)addr_local.content.size_;
        heapString((String *)&f,(kj *)addr_local.content.ptr,value);
        Array<char>::operator=(&hostname.content,(Array<char> *)&f);
      }
      goto LAB_003cf5a1;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[47],kj::StringPtr&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
             ,0x2ae,FAILED,(char *)0x0,"\"can\'t authenticate Unix domain socket with TLS\", addr",
             (char (*) [47])"can\'t authenticate Unix domain socket with TLS",&addr_local);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Promise<Own<NetworkAddress>> parseAddress(StringPtr addr, uint portHint) override {
    // We want to parse the hostname or IP address out of `addr`. This is a bit complicated as
    // KJ's default network implementation has a fairly featureful grammar for these things.
    // In particular, we cannot just split on ':' because the address might be IPv6.

    kj::String hostname;

    if (addr.startsWith("[")) {
      // IPv6, like "[1234:5678::abcd]:123". Take the part between the brackets.
      KJ_IF_SOME(pos, addr.findFirst(']')) {
        hostname = kj::str(addr.slice(1, pos));
      } else {
        // Uhh??? Just take the whole thing, cert will fail later.
        hostname = kj::heapString(addr);
      }
    }